

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

char * NULLCString::strstr(char *__haystack,char *__needle)

{
  int in_ECX;
  char *in_RDX;
  char *pcVar1;
  
  if (__haystack == (char *)0x0) {
    pcVar1 = "string is null";
  }
  else if (in_RDX == (char *)0x0) {
    pcVar1 = "substring is null";
  }
  else if (((int)__needle == 0) || (__haystack[(int)__needle - 1] != '\0')) {
    pcVar1 = "string is not null-terminated";
  }
  else {
    if ((in_ECX != 0) && (in_RDX[in_ECX - 1] == '\0')) {
      pcVar1 = ::strstr(__haystack,in_RDX);
      return (char *)(ulong)(-(uint)(pcVar1 == (char *)0x0) | (int)pcVar1 - (int)__haystack);
    }
    pcVar1 = "substring is not null-terminated";
  }
  nullcThrowError(pcVar1);
  return (char *)0xffffffffffffffff;
}

Assistant:

int strstr(NULLCArray string, NULLCArray substring)
	{
		if(!string.ptr)
		{
			nullcThrowError("string is null");
			return -1;
		}

		if(!substring.ptr)
		{
			nullcThrowError("substring is null");
			return -1;
		}

		if(string.len == 0 || string.ptr[string.len - 1])
		{
			nullcThrowError("string is not null-terminated");
			return -1;
		}

		if(substring.len == 0 || substring.ptr[substring.len - 1])
		{
			nullcThrowError("substring is not null-terminated");
			return -1;
		}

		if(const char *pos = ::strstr(string.ptr, substring.ptr))
			return int(pos - string.ptr);

		return -1;
	}